

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t match_path_inclusion(archive_match *a,match *m,wchar_t mbs,void *pn)

{
  wchar_t wVar1;
  int *piVar2;
  undefined4 in_register_00000014;
  char *p;
  char *local_20;
  
  wVar1 = archive_mstring_get_mbs(&a->archive,&m->pattern,&local_20);
  if (wVar1 == L'\0') {
    wVar1 = __archive_pathmatch(local_20,(char *)CONCAT44(in_register_00000014,mbs),L'\x02');
  }
  else {
    piVar2 = __errno_location();
    wVar1 = L'\0';
    if (*piVar2 == 0xc) {
      archive_set_error(&a->archive,0xc,"No memory");
      (a->archive).state = 0x8000;
      wVar1 = L'\xffffffe2';
    }
  }
  return wVar1;
}

Assistant:

static int
match_path_inclusion(struct archive_match *a, struct match *m,
    int mbs, const void *pn)
{
	int flag = PATHMATCH_NO_ANCHOR_END;
	int r;

	if (mbs) {
		const char *p;
		r = archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch(p, (const char *)pn, flag));
	} else {
		const wchar_t *p;
		r = archive_mstring_get_wcs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch_w(p, (const wchar_t *)pn,
				flag));
	}
	if (errno == ENOMEM)
		return (error_nomem(a));
	return (0);
}